

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O0

void __thiscall QMenu::clear(QMenu *this)

{
  bool bVar1;
  QList<QAction_*> *this_00;
  qsizetype qVar2;
  QWidget *pQVar3;
  reference ppQVar4;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  int i;
  QList<QAction_*> acts;
  QAction *in_stack_ffffffffffffffb8;
  int local_2c;
  QList<QAction_*> local_20;
  QAction *action;
  
  action = *(QAction **)(in_FS_OFFSET + 0x28);
  local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.ptr = (QAction **)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QWidget::actions(in_RDI);
  local_2c = 0;
  while( true ) {
    this_00 = (QList<QAction_*> *)(long)local_2c;
    qVar2 = QList<QAction_*>::size(&local_20);
    if (qVar2 <= (long)this_00) break;
    QList<QAction_*>::operator[](this_00,(qsizetype)in_stack_ffffffffffffffb8);
    QWidget::removeAction(in_RDI,action);
    QList<QAction_*>::operator[](this_00,(qsizetype)in_stack_ffffffffffffffb8);
    pQVar3 = (QWidget *)QObject::parent((QObject *)0x6471a3);
    if (pQVar3 == in_RDI) {
      QList<QAction_*>::operator[](this_00,(qsizetype)in_stack_ffffffffffffffb8);
      QAction::d_func((QAction *)0x6471c4);
      bVar1 = QList<QObject_*>::isEmpty((QList<QObject_*> *)0x6471d3);
      if (bVar1) {
        ppQVar4 = QList<QAction_*>::operator[](this_00,(qsizetype)in_stack_ffffffffffffffb8);
        in_stack_ffffffffffffffb8 = *ppQVar4;
        if (in_stack_ffffffffffffffb8 != (QAction *)0x0) {
          (**(code **)(*(long *)in_stack_ffffffffffffffb8 + 0x20))();
        }
      }
    }
    local_2c = local_2c + 1;
  }
  QList<QAction_*>::~QList((QList<QAction_*> *)0x64721d);
  if (*(QAction **)(in_FS_OFFSET + 0x28) != action) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenu::clear()
{
    QList<QAction*> acts = actions();

    for(int i = 0; i < acts.size(); i++) {
        removeAction(acts[i]);
        if (acts[i]->parent() == this && acts[i]->d_func()->associatedObjects.isEmpty())
            delete acts[i];
    }
}